

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_fchang_2003.h
# Opt level: O0

void __thiscall CT::PerformLabeling(CT *this)

{
  uchar *puVar1;
  uint *puVar2;
  int local_b4;
  int c;
  uint *img_labels_row;
  int r;
  int x;
  uint *img_labels_out_row;
  uchar *img_row;
  int y;
  int local_7c;
  Size local_78;
  Mat_<int> local_70;
  CT *local_10;
  CT *this_local;
  
  local_10 = this;
  cv::MatSize::operator()((MatSize *)&local_78);
  local_7c = 0;
  cv::Mat_<int>::Mat_(&local_70,&local_78,&local_7c);
  cv::Mat_<int>::operator=((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_,&local_70)
  ;
  cv::Mat_<int>::~Mat_(&local_70);
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = 0;
  for (img_row._0_4_ = 0;
      (int)img_row < *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
      img_row._0_4_ = (int)img_row + 1) {
    puVar1 = cv::Mat::ptr<unsigned_char>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat,
                        (int)img_row);
    puVar2 = cv::Mat::ptr<unsigned_int>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat
                        ,(int)img_row);
    for (img_labels_row._4_4_ = 0;
        img_labels_row._4_4_ <
        *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0xc;
        img_labels_row._4_4_ = img_labels_row._4_4_ + 1) {
      if (puVar1[img_labels_row._4_4_] ==
          (this->super_Labeling2D<(Connectivity2D)8,_false>).field_0x74) {
        if ((puVar2[img_labels_row._4_4_] == 0) &&
           ((img_labels_row._4_4_ == 0 ||
            (puVar1[img_labels_row._4_4_ + -1] !=
             (this->super_Labeling2D<(Connectivity2D)8,_false>).field_0x74)))) {
          (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ =
               (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ + 1;
          ContourTracing(this,img_labels_row._4_4_,(int)img_row,
                         (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_,true);
        }
        else if ((img_labels_row._4_4_ <
                  *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0xc + -1
                 ) && ((puVar1[img_labels_row._4_4_ + 1] !=
                        (this->super_Labeling2D<(Connectivity2D)8,_false>).field_0x74 &&
                       (puVar2[img_labels_row._4_4_ + 1] != 0xffffffff)))) {
          if (puVar2[img_labels_row._4_4_] == 0) {
            ContourTracing(this,img_labels_row._4_4_,(int)img_row,puVar2[img_labels_row._4_4_ + -1],
                           false);
          }
          else {
            ContourTracing(this,img_labels_row._4_4_,(int)img_row,puVar2[img_labels_row._4_4_],false
                          );
          }
        }
        else if (puVar2[img_labels_row._4_4_] == 0) {
          puVar2[img_labels_row._4_4_] = puVar2[img_labels_row._4_4_ + -1];
        }
      }
    }
  }
  for (img_labels_row._0_4_ = 0;
      (int)img_labels_row <
      *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x8;
      img_labels_row._0_4_ = (int)img_labels_row + 1) {
    puVar2 = cv::Mat::ptr<unsigned_int>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat
                        ,(int)img_labels_row);
    for (local_b4 = 0;
        local_b4 <
        *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0xc;
        local_b4 = local_b4 + 1) {
      if (puVar2[local_b4] == 0xffffffff) {
        puVar2[local_b4] = 0;
      }
    }
  }
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ =
       (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ + 1;
  return;
}

Assistant:

void PerformLabeling()
    {
        img_labels_ = cv::Mat1i(img_.size(), 0);

        n_labels_ = 0;
        for (int y = 0; y < img_.rows; y++) {
            const unsigned char* const img_row = img_.ptr<unsigned char>(y);
            unsigned int* const img_labels_out_row = img_labels_.ptr<unsigned int>(y);
            for (int x = 0; x < img_.cols; x++) {

                if (img_row[x] == byF) {
                    // Case 1
                    if (img_labels_out_row[x] == 0 && (x == 0 || img_row[x - 1] != byF)) {
                        n_labels_++;
                        ContourTracing(x, y, n_labels_, true);
                        continue;
                    }
                    // Case 2
                    else if (x < img_.cols - 1 && img_row[x + 1] != byF && img_labels_out_row[x + 1] != -1) {
                        if (img_labels_out_row[x] == 0) {
                            // Current pixel unlabeled
                            // Assing label of left pixel
                            ContourTracing(x, y, img_labels_out_row[x - 1], false);
                        }
                        else {
                            ContourTracing(x, y, img_labels_out_row[x], false);
                        }
                        continue;
                    }
                    // case 3
                    else if (img_labels_out_row[x] == 0) {
                        img_labels_out_row[x] = img_labels_out_row[x - 1];
                    }
                }
            }
        }

        // Reassign to contour background value (0)
        for (int r = 0; r < img_labels_.rows; ++r) {
            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
            for (int c = 0; c < img_labels_.cols; ++c) {
                if (img_labels_row[c] == -1)
                    img_labels_row[c] = 0;
            }
        }

        n_labels_++; // To count also background label
    }